

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

FieldDescriptor *
google::protobuf::(anonymous_namespace)::
GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
           *ext,Descriptor *descriptor)

{
  Descriptor *extendee;
  int number;
  FileDescriptor *this;
  DescriptorPool *this_00;
  FieldDescriptor *pFVar1;
  FieldDescriptor *local_20;
  Descriptor *local_18;
  Descriptor *descriptor_local;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
  *ext_local;
  
  local_18 = descriptor;
  descriptor_local = (Descriptor *)ext;
  this = Descriptor::file(descriptor);
  this_00 = FileDescriptor::pool(this);
  extendee = local_18;
  number = internal::
           ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)'\v',_false>
           ::number((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                     *)descriptor_local);
  local_20 = DescriptorPool::FindExtensionByNumber(this_00,extendee,number);
  pFVar1 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FieldDescriptor_const*>
                     ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
                      ,0x49,
                      "descriptor->file()->pool()->FindExtensionByNumber( descriptor, ext.number())"
                      ,&local_20);
  return pFVar1;
}

Assistant:

const FieldDescriptor* GetExtension(
    const ExtensionT& ext,
    const Descriptor* descriptor = FeatureSet::descriptor()) {
  return ABSL_DIE_IF_NULL(descriptor->file()->pool()->FindExtensionByNumber(
      descriptor, ext.number()));
}